

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AV1QuantizeTest_EobVerify_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1QuantizeTest_EobVerify_Test> *this)

{
  AV1QuantizeTest *this_00;
  
  WithParamInterface<(anonymous_namespace)::QuantizeFuncParams>::parameter_ = &this->parameter_;
  this_00 = (AV1QuantizeTest *)operator_new(0x30);
  anon_unknown.dwarf_129e39::AV1QuantizeTest::AV1QuantizeTest(this_00);
  (this_00->super_TestWithParam<(anonymous_namespace)::QuantizeFuncParams>).super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_00edb918;
  (this_00->super_TestWithParam<(anonymous_namespace)::QuantizeFuncParams>).
  super_WithParamInterface<(anonymous_namespace)::QuantizeFuncParams>._vptr_WithParamInterface =
       (_func_int **)&DAT_00edb958;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }